

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall CVmObjVector::mark_refs(CVmObjVector *this,uint state)

{
  vm_datatype_t vVar1;
  CVmObjTable *this_00;
  size_t in_RDI;
  char *p;
  size_t cnt;
  CVmObjVector *in_stack_ffffffffffffffe0;
  size_t local_18;
  
  local_18 = get_element_count((CVmObjVector *)0x3a2eab);
  this_00 = (CVmObjTable *)get_element_ptr(in_stack_ffffffffffffffe0,in_RDI);
  while (local_18 != 0) {
    vVar1 = vmb_get_dh_type((char *)this_00);
    if (vVar1 == VM_OBJ) {
      vmb_get_dh_obj((char *)0x3a2ee3);
      CVmObjTable::mark_all_refs(this_00,(vm_obj_id_t)(in_RDI >> 0x20),(uint)in_RDI);
    }
    local_18 = local_18 - 1;
    inc_element_ptr((char **)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void CVmObjVector::mark_refs(VMG_ uint state)
{
    /* get my element count */
    size_t cnt = get_element_count();

    /* mark as referenced each object in the vector */
    for (char *p = get_element_ptr(0) ; cnt != 0 ;
         --cnt, inc_element_ptr(&p))
    {
        /* 
         *   if this is an object, mark it as referenced, and mark its
         *   references as referenced 
         */
        if (vmb_get_dh_type(p) == VM_OBJ)
            G_obj_table->mark_all_refs(vmb_get_dh_obj(p), state);
    }
}